

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFiveAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFiveAction::Use(BlueRoomFiveAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  BlueRoomFiveAction *local_18;
  BlueRoomFiveAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TORCH) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"You\'ve already used the torch.",&local_39);
    ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_38);
    local_4d = 0;
    this_local = (BlueRoomFiveAction *)pAVar2;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == STATUE) {
      pAVar2 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,
                 "The statue awaits your action. You attempt to trigger its innate action. Kind of a stand off I guess. Maybe try something else?"
                 ,&local_71);
      ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_70);
      this_local = (BlueRoomFiveAction *)pAVar2;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      this_local = (BlueRoomFiveAction *)AbstractRoomAction::Use(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *BlueRoomFiveAction::Use() {
    if(commands->getMainItem() == TORCH) {
        return new ActionResults(CURRENT, "You've already used the torch.");
    }else if(commands->getMainItem() == STATUE){
        return new ActionResults(CURRENT, "The statue awaits your action. You attempt to trigger its innate action. Kind of a stand off I guess. Maybe try something else?");
    }else {
        return AbstractRoomAction::Use();
    }
}